

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.cpp
# Opt level: O2

void __thiscall
TPZSYsmpMatrix<double>::TPZSYsmpMatrix(TPZSYsmpMatrix<double> *this,int64_t rows,int64_t cols)

{
  TPZMatrix<double>::TPZMatrix(&this->super_TPZMatrix<double>,&PTR_PTR_0168ad48,rows,cols);
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSYsmpMatrix_0168aac0;
  (this->fIA)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fIA).fNAlloc = 0;
  (this->fIA).fStore = (long *)0x0;
  (this->fIA).fNElements = 0;
  (this->fJA)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fJA).fStore = (long *)0x0;
  (this->fJA).fNElements = 0;
  (this->fJA).fNAlloc = 0;
  (this->fA)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649128;
  (this->fA).fStore = (double *)0x0;
  (this->fA).fNElements = 0;
  (this->fA).fNAlloc = 0;
  TPZPardisoSolver<double>::TPZPardisoSolver(&this->fPardisoControl);
  (this->fDiag)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649128;
  (this->fDiag).fStore = (double *)0x0;
  (this->fDiag).fNElements = 0;
  (this->fDiag).fNAlloc = 0;
  return;
}

Assistant:

TPZSYsmpMatrix<TVar>::TPZSYsmpMatrix(const int64_t rows,const int64_t cols ) : TPZRegisterClassId(&TPZSYsmpMatrix::ClassId),
TPZMatrix<TVar>(rows,cols) {

#ifdef CONSTRUCTOR
	cerr << "TPZSYsmpMatrix(int rows,int cols)\n";
#endif
}